

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.h
# Opt level: O1

ostream * operator<<(ostream *out,Company *cp)

{
  Employee **ppEVar1;
  Employee *pEVar2;
  size_type sVar3;
  size_type sVar4;
  ostream *os;
  ulong uVar5;
  int iVar6;
  Company *this;
  ostream *poVar7;
  long *plVar8;
  size_type __n;
  ulong __n_00;
  bool bVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  string local_c0;
  string local_a0;
  ulong local_80;
  ostream *local_78;
  string local_70;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_78 = out;
  this = (Company *)operator_new(0x18);
  Company::Company(this,cp);
  do {
    iVar6 = Boss::getNumberOfEmployees(this->boss);
    if (iVar6 < 2) break;
    lVar10 = 0;
    bVar9 = false;
    do {
      Person::getName_abi_cxx11_(&local_c0,&this->employees[lVar10]->super_Person);
      Person::getName_abi_cxx11_(&local_a0,&this->employees[lVar10 + 1]->super_Person);
      sVar4 = local_a0._M_string_length;
      sVar3 = local_c0._M_string_length;
      __n = local_c0._M_string_length;
      if (local_a0._M_string_length < local_c0._M_string_length) {
        __n = local_a0._M_string_length;
      }
      if (__n == 0) {
        iVar6 = 0;
      }
      else {
        iVar6 = memcmp(local_c0._M_dataplus._M_p,local_a0._M_dataplus._M_p,__n);
      }
      if (iVar6 == 0) {
        lVar11 = sVar3 - sVar4;
        if (lVar11 < -0x7fffffff) {
          lVar11 = -0x80000000;
        }
        if (0x7ffffffe < lVar11) {
          lVar11 = 0x7fffffff;
        }
        iVar6 = (int)lVar11;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (0 < iVar6) {
        ppEVar1 = this->employees;
        pEVar2 = ppEVar1[lVar10];
        ppEVar1[lVar10] = ppEVar1[lVar10 + 1];
        ppEVar1[lVar10 + 1] = pEVar2;
        bVar9 = true;
      }
      lVar10 = lVar10 + 1;
      iVar6 = Boss::getNumberOfEmployees(this->boss);
    } while (lVar10 < iVar6 + -1);
  } while (bVar9);
  do {
    iVar6 = Boss::getNumberOfEmployees(this->boss);
    if (iVar6 < 2) break;
    lVar10 = 0;
    local_80 = 0;
    do {
      Person::getId_abi_cxx11_(&local_a0,&this->employees[lVar10]->super_Person);
      std::__cxx11::string::substr((ulong)&local_c0,(ulong)&local_a0);
      Person::getId_abi_cxx11_(&local_70,&this->employees[lVar10 + 1]->super_Person);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
      uVar5 = local_48;
      sVar3 = local_c0._M_string_length;
      __n_00 = local_c0._M_string_length;
      if (local_48 < local_c0._M_string_length) {
        __n_00 = local_48;
      }
      if (__n_00 == 0) {
        iVar6 = 0;
      }
      else {
        iVar6 = memcmp(local_c0._M_dataplus._M_p,local_50,__n_00);
      }
      if (iVar6 == 0) {
        lVar11 = sVar3 - uVar5;
        if (lVar11 < -0x7fffffff) {
          lVar11 = -0x80000000;
        }
        if (0x7ffffffe < lVar11) {
          lVar11 = 0x7fffffff;
        }
        iVar6 = (int)lVar11;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (iVar6 < 0) {
        ppEVar1 = this->employees;
        pEVar2 = ppEVar1[lVar10];
        ppEVar1[lVar10] = ppEVar1[lVar10 + 1];
        ppEVar1[lVar10 + 1] = pEVar2;
        local_80 = CONCAT71((int7)((ulong)ppEVar1 >> 8),1);
      }
      lVar10 = lVar10 + 1;
      iVar6 = Boss::getNumberOfEmployees(this->boss);
    } while (lVar10 < iVar6 + -1);
  } while ((local_80 & 1) != 0);
  os = local_78;
  std::__ostream_insert<char,std::char_traits<char>>(local_78,"Boss : ",7);
  poVar7 = operator<<(os,this->boss);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  plVar8 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  iVar6 = Boss::getNumberOfEmployees(this->boss);
  if (0 < iVar6) {
    lVar10 = 0;
    do {
      poVar7 = operator<<(os,this->employees[lVar10]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      dVar12 = Employee::efficiency(this->employees[lVar10]);
      poVar7 = std::ostream::_M_insert<double>(dVar12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      plVar8 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
      lVar10 = lVar10 + 1;
      iVar6 = Boss::getNumberOfEmployees(this->boss);
    } while (lVar10 < iVar6);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const Company &cp) {
          auto *temp = new Company(cp);
        bool flag = true;
        while (flag) {
            flag = false;
            for (int i = 0; i < temp->boss->getNumberOfEmployees() - 1; ++i) {
                if (temp->employees[i]->getName() > temp->employees[i + 1]->getName()) {
                    std::swap(temp->employees[i], temp->employees[i + 1]);
                    flag = true;
                }
            }
        }
        flag = true;
        while (flag) {
            flag = false;
            for (int i = 0; i < temp->boss->getNumberOfEmployees() - 1; ++i) {
                if (temp->employees[i]->getId().substr(0, 2) < temp->employees[i + 1]->getId().substr(0, 2)) {
                    std::swap(temp->employees[i], temp->employees[i + 1]);
                    flag = true;
                }
            }
        }


        out << "Boss : "<<*(temp->boss) << std::endl << std::endl;
        for (int i = 0; i < temp->boss->getNumberOfEmployees(); ++i) {
            out << *(temp->employees[i]) << std::endl << temp->employees[i]->efficiency() << std::endl << std::endl;

        }
        return out;
    }